

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall
mocker::ir::Assign::Assign
          (Assign *this,shared_ptr<mocker::ir::Reg> *dest,shared_ptr<mocker::ir::Addr> *operand)

{
  shared_ptr<mocker::ir::Reg> local_30;
  shared_ptr<mocker::ir::Addr> *local_20;
  shared_ptr<mocker::ir::Addr> *operand_local;
  shared_ptr<mocker::ir::Reg> *dest_local;
  Assign *this_local;
  
  local_20 = operand;
  operand_local = (shared_ptr<mocker::ir::Addr> *)dest;
  dest_local = (shared_ptr<mocker::ir::Reg> *)this;
  IRInst::IRInst(&this->super_IRInst,Assign);
  std::shared_ptr<mocker::ir::Reg>::shared_ptr(&local_30,dest);
  Definition::Definition(&this->super_Definition,&local_30);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_30);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Assign_00188338;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Assign_00188358;
  std::shared_ptr<mocker::ir::Addr>::shared_ptr(&this->operand,operand);
  return;
}

Assistant:

Assign(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> operand)
      : IRInst(InstType::Assign), Definition(std::move(dest)),
        operand(std::move(operand)) {}